

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

string * __thiscall cmCTest::CurrentTime_abi_cxx11_(string *__return_storage_ptr__,cmCTest *this)

{
  pointer pPVar1;
  ostream *poVar2;
  char *msg;
  allocator<char> local_5f1;
  string local_5f0;
  string local_5d0 [48];
  ostringstream local_5a0 [8];
  ostringstream cmCTestLog_msg;
  char local_428 [8];
  char current_time [1024];
  tm *t;
  time_t currenttime;
  cmCTest *this_local;
  
  currenttime = (time_t)this;
  this_local = (cmCTest *)__return_storage_ptr__;
  t = (tm *)time((time_t *)0x0);
  current_time._1016_8_ = localtime((time_t *)&t);
  pPVar1 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  if ((pPVar1->ShortDateFormat & 1U) == 0) {
    strftime(local_428,1000,"%a %b %d %H:%M:%S %Z %Y",(tm *)current_time._1016_8_);
  }
  else {
    strftime(local_428,1000,"%b %d %H:%M %Z",(tm *)current_time._1016_8_);
  }
  std::__cxx11::ostringstream::ostringstream(local_5a0);
  poVar2 = std::operator<<((ostream *)local_5a0,"   Current_Time: ");
  poVar2 = std::operator<<(poVar2,local_428);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  msg = (char *)std::__cxx11::string::c_str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx",
      0x13a,msg,false);
  std::__cxx11::string::~string(local_5d0);
  std::__cxx11::ostringstream::~ostringstream(local_5a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f0,local_428,&local_5f1);
  CleanString(__return_storage_ptr__,&local_5f0,0);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::allocator<char>::~allocator(&local_5f1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::CurrentTime()
{
  time_t currenttime = time(nullptr);
  struct tm* t = localtime(&currenttime);
  // return ::CleanString(ctime(&currenttime));
  char current_time[1024];
  if (this->Impl->ShortDateFormat) {
    strftime(current_time, 1000, "%b %d %H:%M %Z", t);
  } else {
    strftime(current_time, 1000, "%a %b %d %H:%M:%S %Z %Y", t);
  }
  cmCTestLog(this, DEBUG, "   Current_Time: " << current_time << std::endl);
  return cmCTest::CleanString(current_time);
}